

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O3

void Js::PropertyValueInfo::SetCacheInfo
               (PropertyValueInfo *info,FunctionBody *functionBody,
               PolymorphicInlineCache *polymorphicInlineCache,InlineCacheIndex inlineCacheIndex,
               bool allowResizingPolymorphicInlineCache)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  
  if (info == (PropertyValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x56,"(info)","info");
    if (!bVar2) goto LAB_00dcdcd7;
    *puVar4 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x57,"(functionBody)","functionBody");
    if (!bVar2) goto LAB_00dcdcd7;
    *puVar4 = 0;
  }
  if (polymorphicInlineCache == (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x58,"(polymorphicInlineCache)","polymorphicInlineCache");
    if (!bVar2) goto LAB_00dcdcd7;
    *puVar4 = 0;
  }
  uVar3 = FunctionBody::GetCountField(functionBody,InlineCacheCount);
  if (uVar3 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x59,"(inlineCacheIndex < functionBody->GetInlineCacheCount())",
                                "inlineCacheIndex < functionBody->GetInlineCacheCount()");
    if (!bVar2) {
LAB_00dcdcd7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  info->functionBody = functionBody;
  info->inlineCache = (InlineCache *)0x0;
  info->polymorphicInlineCache = polymorphicInlineCache;
  info->inlineCacheIndex = inlineCacheIndex;
  info->allowResizingPolymorphicInlineCache = allowResizingPolymorphicInlineCache;
  return;
}

Assistant:

void PropertyValueInfo::SetCacheInfo(
        PropertyValueInfo* info,
        FunctionBody *const functionBody,
        PolymorphicInlineCache *const polymorphicInlineCache,
        const InlineCacheIndex inlineCacheIndex,
        const bool allowResizingPolymorphicInlineCache)
    {
        Assert(info);
        Assert(functionBody);
        Assert(polymorphicInlineCache);
        Assert(inlineCacheIndex < functionBody->GetInlineCacheCount());

        info->functionBody = functionBody;
        info->inlineCache = nullptr;
        info->polymorphicInlineCache = polymorphicInlineCache;
        info->inlineCacheIndex = inlineCacheIndex;
        info->allowResizingPolymorphicInlineCache = allowResizingPolymorphicInlineCache;
    }